

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

void InitClassMap(FClassMap *themap,SpawnMap *thedata)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  Pair *pair;
  FName local_54;
  PClassActor *cls;
  SpawnMap *local_48;
  Iterator it;
  
  TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::Clear(themap,1);
  it.Position = 0;
  uVar3 = 0;
  local_48 = thedata;
  it.Map = thedata;
  while( true ) {
    bVar2 = TMapIterator<int,_MapinfoSpawnItem,_TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>_>
            ::NextPair(&it,&pair);
    if (!bVar2) break;
    cls = (PClassActor *)0x0;
    iVar1 = (pair->Value).classname.Index;
    if (iVar1 == 0) {
      TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::DelKey
                (themap,pair->Key);
    }
    else {
      local_54.Index = iVar1;
      cls = PClass::FindActor(&local_54);
      if (cls == (PClassActor *)0x0) {
        Printf("\x1cGScript error, \"%s\" line %d:\nUnknown actor class %s\n",
               (pair->Value).filename.Chars,(ulong)(uint)(pair->Value).linenum,
               FName::NameData.NameArray[(pair->Value).classname.Index].Text);
        uVar3 = uVar3 + 1;
      }
      TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::Insert
                (themap,pair->Key,&cls);
    }
  }
  if (0 < (int)uVar3) {
    I_Error("%d unknown actor classes found",(ulong)uVar3);
  }
  TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::Clear(local_48,1);
  return;
}

Assistant:

void InitClassMap(FClassMap &themap, SpawnMap &thedata)
{
	themap.Clear();
	SpawnMap::Iterator it(thedata);
	SpawnMap::Pair *pair;
	int error = 0;

	while (it.NextPair(pair))
	{
		PClassActor *cls = NULL;
		if (pair->Value.classname != NAME_None)
		{
			cls = PClass::FindActor(pair->Value.classname);
			if (cls == NULL)
			{
				Printf(TEXTCOLOR_RED "Script error, \"%s\" line %d:\nUnknown actor class %s\n",
					pair->Value.filename.GetChars(), pair->Value.linenum, pair->Value.classname.GetChars());
				error++;
			}
			themap.Insert(pair->Key, cls);
		}
		else
		{
			themap.Remove(pair->Key);
		}
	}
	if (error > 0)
	{
		I_Error("%d unknown actor classes found", error);
	}
	thedata.Clear();	// we do not need this any longer
}